

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::StringVector::ByteSizeLong(StringVector *this)

{
  uint uVar1;
  Type *value;
  size_t sVar2;
  int index;
  ulong uVar3;
  size_t sVar4;
  
  uVar1 = (this->vector_).super_RepeatedPtrFieldBase.current_size_;
  sVar4 = (size_t)uVar1;
  uVar3 = 0;
  index = 0;
  if (0 < (int)uVar1) {
    uVar3 = sVar4;
    index = 0;
  }
  for (; (int)uVar3 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                      (&(this->vector_).super_RepeatedPtrFieldBase,index);
    sVar2 = google::protobuf::internal::WireFormatLite::StringSize(value);
    sVar4 = sVar4 + sVar2;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t StringVector::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.StringVector)
  size_t total_size = 0;

  // repeated string vector = 1;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->vector_size());
  for (int i = 0, n = this->vector_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->vector(i));
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}